

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.h
# Opt level: O0

void __thiscall
basist::basisu_lowlevel_etc1s_transcoder::clear(basisu_lowlevel_etc1s_transcoder *this)

{
  huffman_decoding_table *in_RDI;
  
  basisu::vector<basist::endpoint>::clear((vector<basist::endpoint> *)in_RDI);
  basisu::vector<basist::selector>::clear((vector<basist::selector> *)in_RDI);
  huffman_decoding_table::clear(in_RDI);
  huffman_decoding_table::clear(in_RDI);
  huffman_decoding_table::clear(in_RDI);
  huffman_decoding_table::clear(in_RDI);
  in_RDI[4].m_tree.m_size = 0;
  return;
}

Assistant:

void clear()
		{
			m_local_endpoints.clear();
			m_local_selectors.clear();
			m_endpoint_pred_model.clear();
			m_delta_endpoint_model.clear();
			m_selector_model.clear();
			m_selector_history_buf_rle_model.clear();
			m_selector_history_buf_size = 0;
		}